

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

size_t art_size_in_bytes(art_t *art)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  
  if (art->first_free[1] == art->capacities[1]) {
    uVar3 = 0;
    do {
      if (uVar3 == 4) goto LAB_00105a6e;
      lVar5 = uVar3 + 2;
      uVar1 = uVar3 + 1;
      lVar2 = uVar3 + 2;
      uVar3 = uVar1;
    } while (art->first_free[lVar5] == art->capacities[lVar2]);
    if (4 < uVar1) {
LAB_00105a6e:
      sVar4 = 0x38;
      lVar5 = 0;
      do {
        sVar4 = sVar4 + ART_NODE_SIZES[lVar5 + 1] * art->capacities[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 5);
      return sVar4;
    }
  }
  return 0;
}

Assistant:

size_t art_size_in_bytes(const art_t *art) {
    if (!art_is_shrunken(art)) {
        return 0;
    }
    // Root.
    size_t size = sizeof(art->root);
    // Node counts.
    size += sizeof(art->capacities);
    // Alignment for leaves. The rest of the nodes are aligned the same way.
    size +=
        ((size + alignof(art_leaf_t) - 1) & ~(alignof(art_leaf_t) - 1)) - size;
    for (art_typecode_t t = CROARING_ART_MIN_TYPE; t <= CROARING_ART_MAX_TYPE;
         ++t) {
        size += art->capacities[t] * ART_NODE_SIZES[t];
    }
    return size;
}